

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

void __thiscall
nonstd::span_lite::detail::contract_violation::contract_violation
          (contract_violation *this,char *message)

{
  std::logic_error::logic_error(&this->super_logic_error,message);
  *(undefined ***)this = &PTR__logic_error_001a4b48;
  return;
}

Assistant:

explicit contract_violation( char const * const message )
        : std::logic_error( message )
    {}